

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

string * __thiscall
pstack::CacheReader::readString_abi_cxx11_(string *__return_storage_ptr__,CacheReader *this,Off off)

{
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar1;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  char *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  local_78 = local_68;
  local_50 = local_48._M_local_buf + 8;
  local_48._M_local_buf[8] = '\0';
  local_48._M_allocated_capacity = 0;
  local_70 = 0;
  local_68[0] = 0;
  local_58 = (undefined1  [8])off;
  pVar1 = std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,std::__cxx11::string>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->stringCache,local_58);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_78);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    Reader::readString_abi_cxx11_((string *)local_58,&this->super_Reader,off);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)pVar1.first.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      ._M_cur.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
               + 0x10),(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)pVar1.first.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    ._M_cur.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
             + 0x10));
  return __return_storage_ptr__;
}

Assistant:

string
CacheReader::readString(Off off) const
{
    auto [it, neu] = stringCache.insert(std::make_pair(off, std::string{}));
    if (neu)
        it->second = Reader::readString(off);
    return it->second;
}